

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int mkdir_p(char *path)

{
  int iVar1;
  int *piVar2;
  char *in_RDI;
  char *p;
  char mypath [4096];
  size_t len;
  char *local_1020;
  char local_1018;
  char local_1017 [4095];
  ulong local_18;
  char *local_10;
  int local_4;
  
  local_10 = in_RDI;
  local_18 = strlen(in_RDI);
  piVar2 = __errno_location();
  *piVar2 = 0;
  if (local_18 < 0x1000) {
    strcpy(&local_1018,local_10);
    for (local_1020 = local_1017; *local_1020 != '\0'; local_1020 = local_1020 + 1) {
      if (*local_1020 == '/') {
        *local_1020 = '\0';
        iVar1 = mkdir(&local_1018,0x1c0);
        if ((iVar1 != 0) && (piVar2 = __errno_location(), *piVar2 != 0x11)) {
          return -1;
        }
        *local_1020 = '/';
      }
    }
    iVar1 = mkdir(&local_1018,0x1c0);
    if ((iVar1 == 0) || (piVar2 = __errno_location(), *piVar2 == 0x11)) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    fprintf(_stderr,"Output directory path too long\n");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int mkdir_p(const char *path)
{
    const size_t len = strlen(path);
    char mypath[PATH_MAX];
    char *p;

    errno = 0;

    /* copy string so its mutable */
    if (len > sizeof(mypath)-1) {
        fprintf(stderr, "Output directory path too long\n");
        return -1;
    }

    strcpy(mypath, path);

    /* iterate the string */
    for (p = mypath + 1; *p; p++) {
        if (*p == '/') {
            /* temporarily truncate */
            *p = '\0';

            if (mkdir(mypath, S_IRWXU) != 0) {
                if (errno != EEXIST)
                    return -1;
            }
            *p = '/';
        }
    }

    if (mkdir(mypath, S_IRWXU) != 0) {
        if (errno != EEXIST)
            return -1;
    }

    return 0;
}